

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportInstallFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  cmMakefile *this_00;
  bool bVar1;
  cmFileSet *pcVar2;
  bool bVar3;
  byte bVar4;
  mapped_type *ppcVar5;
  string *psVar6;
  ostream *poVar7;
  WrapQuotes wrapQuotes;
  pointer config;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  string_view separator;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmFileSet *fileSet_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  cmExportInstallFileGenerator *local_278;
  string *local_270;
  string local_268;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [3];
  string local_208;
  string dest;
  string local_1c8 [32];
  ostringstream e;
  
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fileSet_local = fileSet;
  local_278 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,gte->Makefile,IncludeEmptyConfig);
  local_298.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_298.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_298);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_298.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ppcVar5 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&fileSet_local);
  std::__cxx11::string::string
            (local_1c8,(string *)&((*ppcVar5)->super_cmInstallGenerator).Destination);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
  std::__cxx11::string::~string(local_1c8);
  local_270 = configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_280 = &__return_storage_ptr__->field_2;
  config = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (config == local_270) goto LAB_003fac79;
    _e = 0x12;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    wrapQuotes = Wrap;
    psVar6 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        gte->LocalGenerator,config,gte,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,&local_208);
    str._M_str = (char *)0x1;
    str._M_len = (size_t)(psVar6->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_268,(cmOutputConverter *)psVar6->_M_string_length,str,wrapQuotes);
    local_238[0]._M_allocated_capacity = local_268._M_string_length;
    local_238[0]._8_8_ = local_268._M_dataplus._M_p;
    cmStrCat<>(&dest,(cmAlphaNum *)&e,(cmAlphaNum *)local_238);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_208);
    pcVar2 = fileSet_local;
    bVar4 = *(byte *)((long)cge._M_t.
                            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                            _M_head_impl + 0x130);
    if (bVar4 == 1) {
      __x._M_str = (fileSet_local->Type)._M_dataplus._M_p;
      __x._M_len = (fileSet_local->Type)._M_string_length;
      __y._M_str = "CXX_MODULES";
      __y._M_len = 0xb;
      bVar3 = std::operator==(__x,__y);
      if (!bVar3) {
        __x_00._M_str = (pcVar2->Type)._M_dataplus._M_p;
        __x_00._M_len = (pcVar2->Type)._M_string_length;
        __y_00._M_str = "CXX_MODULE_HEADER_UNITS";
        __y_00._M_len = 0x17;
        bVar3 = std::operator==(__x_00,__y_00);
        if (!bVar3) {
          bVar4 = *(byte *)((long)cge._M_t.
                                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                  _M_head_impl + 0x130);
          goto LAB_003fab4b;
        }
      }
      this_00 = local_278->IEGen->LocalGenerator->Makefile;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar7 = std::operator<<((ostream *)&e,"The \"");
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
      poVar7 = std::operator<<(poVar7,(string *)psVar6);
      poVar7 = std::operator<<(poVar7,"\" target\'s interface file set \"");
      poVar7 = std::operator<<(poVar7,(string *)fileSet_local);
      poVar7 = std::operator<<(poVar7,"\" of type \"");
      poVar7 = std::operator<<(poVar7,(string *)&pcVar2->Type);
      std::operator<<(poVar7,
                      "\" contains context-sensitive base file entries which is not supported.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_238);
      std::__cxx11::string::~string((string *)local_238[0]._M_local_buf);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_280;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar3 = false;
LAB_003fac51:
      bVar1 = false;
    }
    else {
LAB_003fab4b:
      if (((bVar4 & 1) != 0) &&
         ((long)configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
        _e = 0xc;
        local_238[0]._8_8_ = (config->_M_dataplus)._M_p;
        local_238[0]._0_8_ = config->_M_string_length;
        cmStrCat<char[3],std::__cxx11::string,char[3]>
                  (&local_268,(cmAlphaNum *)&e,(cmAlphaNum *)local_238,(char (*) [3])">:",&dest,
                   (char (*) [3])">\"");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &resultVector,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        bVar3 = true;
        goto LAB_003fac51;
      }
      _e = 1;
      local_238[0]._M_allocated_capacity = dest._M_string_length;
      local_238[0]._8_8_ = dest._M_dataplus._M_p;
      local_208._M_dataplus._M_p._0_1_ = 0x22;
      cmStrCat<char>(&local_268,(cmAlphaNum *)&e,(cmAlphaNum *)local_238,(char *)&local_208);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&resultVector,
                 &local_268);
      std::__cxx11::string::~string((string *)&local_268);
      bVar1 = true;
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&dest);
    config = config + 1;
  } while (bVar3);
  if (bVar1) {
LAB_003fac79:
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(__return_storage_ptr__,&resultVector,separator,(string_view)ZEXT816(0));
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&resultVector);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  cmGeneratorExpression ge;
  auto cge = ge.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto dest = cmStrCat("${_IMPORT_PREFIX}/",
                         cmOutputConverter::EscapeForCMake(
                           cge->Evaluate(gte->LocalGenerator, config, gte),
                           cmOutputConverter::WrapQuotes::NoWrap));

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (cge->GetHadContextSensitiveCondition() &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    if (cge->GetHadContextSensitiveCondition() && configs.size() != 1) {
      resultVector.push_back(
        cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
    } else {
      resultVector.push_back(cmStrCat('"', dest, '"'));
      break;
    }
  }

  return cmJoin(resultVector, " ");
}